

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_encoder_utf.c
# Opt level: O1

HPDF_STATUS HPDF_UseUTFEncodings(HPDF_Doc pdf)

{
  HPDF_BOOL HVar1;
  HPDF_Encoder encoder;
  HPDF_STATUS HVar2;
  
  HVar1 = HPDF_HasDoc(pdf);
  if (HVar1 != 0) {
    encoder = HPDF_CMapEncoder_New(pdf->mmgr,"UTF-8",UTF8_Init);
    HVar2 = HPDF_Doc_RegisterEncoder(pdf,encoder);
    return HVar2;
  }
  return 0x1025;
}

Assistant:

HPDF_EXPORT(HPDF_STATUS)
HPDF_UseUTFEncodings   (HPDF_Doc   pdf)
{
    HPDF_Encoder encoder;
    HPDF_STATUS ret;

    if (!HPDF_HasDoc (pdf))
        return HPDF_INVALID_DOCUMENT;

    encoder = HPDF_CMapEncoder_New (pdf->mmgr,  "UTF-8",
                UTF8_Init);

    if ((ret = HPDF_Doc_RegisterEncoder (pdf, encoder)) != HPDF_OK)
        return ret;

    return HPDF_OK;
}